

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O0

void ppc6xx_tlb_store(CPUPPCState_conflict2 *env,target_ulong EPN,int way,int is_code,
                     target_ulong pte0,target_ulong pte1)

{
  int iVar1;
  ppc6xx_tlb_t_conflict2 *ppVar2;
  int nr;
  ppc6xx_tlb_t_conflict2 *tlb;
  target_ulong pte1_local;
  target_ulong pte0_local;
  int is_code_local;
  int way_local;
  target_ulong EPN_local;
  CPUPPCState_conflict2 *env_local;
  
  iVar1 = ppc6xx_tlb_getnum(env,EPN,way,is_code);
  ppVar2 = (env->tlb).tlb6 + iVar1;
  ppc6xx_tlb_invalidate_virt2(env,EPN,is_code,1);
  ppVar2->pte0 = pte0;
  ppVar2->pte1 = pte1;
  ppVar2->EPN = EPN;
  env->last_way = way;
  return;
}

Assistant:

static void ppc6xx_tlb_store(CPUPPCState *env, target_ulong EPN, int way,
                             int is_code, target_ulong pte0, target_ulong pte1)
{
    ppc6xx_tlb_t *tlb;
    int nr;

    nr = ppc6xx_tlb_getnum(env, EPN, way, is_code);
    tlb = &env->tlb.tlb6[nr];
    LOG_SWTLB("Set TLB %d/%d EPN " TARGET_FMT_lx " PTE0 " TARGET_FMT_lx
              " PTE1 " TARGET_FMT_lx "\n", nr, env->nb_tlb, EPN, pte0, pte1);
    /* Invalidate any pending reference in QEMU for this virtual address */
    ppc6xx_tlb_invalidate_virt2(env, EPN, is_code, 1);
    tlb->pte0 = pte0;
    tlb->pte1 = pte1;
    tlb->EPN = EPN;
    /* Store last way for LRU mechanism */
    env->last_way = way;
}